

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

bool __thiscall LinearScan::SkipNumberedInstr(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  LabelInstr *pLVar5;
  undefined4 *puVar6;
  
  if ((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) {
    pLVar5 = IR::Instr::AsLabelInstr(instr);
    if ((pLVar5->field_0x78 & 1) == 0) {
      return true;
    }
    uVar3 = IR::Instr::GetNumber(instr);
    uVar4 = IR::Instr::GetNumber(instr->m_next);
    if (uVar3 != uVar4) {
      uVar3 = IR::Instr::GetNumber(instr);
      uVar4 = IR::Instr::GetNumber(instr->m_prev);
      if (uVar3 != uVar4) {
        return false;
      }
      if (instr->m_prev->m_opcode == Nop) {
        return false;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x92b,
                       "(instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop))"
                       ,
                       "instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return false;
}

Assistant:

bool
LinearScan::SkipNumberedInstr(IR::Instr *instr)
{
    if (instr->IsLabelInstr())
    {
        if (instr->AsLabelInstr()->m_isLoopTop)
        {
            Assert(instr->GetNumber() != instr->m_next->GetNumber()
                && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop));
        }
        else
        {
            return true;
        }
    }
    return false;
}